

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d.cpp
# Opt level: O2

ggml_cgraph * compute_graph(test_model *model,ggml_gallocr_t allocr)

{
  char cVar1;
  ggml_cgraph *pgVar2;
  
  pgVar2 = build_graph(model);
  ggml_gallocr_alloc_graph(allocr,pgVar2);
  cVar1 = ggml_backend_is_cpu(model->backend);
  if (cVar1 != '\0') {
    ggml_backend_cpu_set_n_threads(model->backend,1);
  }
  ggml_backend_graph_compute(model->backend,pgVar2);
  return pgVar2;
}

Assistant:

struct ggml_cgraph * compute_graph(const test_model & model, ggml_gallocr_t allocr) {
    struct ggml_cgraph * gf = build_graph(model);

    // allocate tensors
    ggml_gallocr_alloc_graph(allocr, gf);
    int n_threads = 1;

    if (ggml_backend_is_cpu(model.backend)) {
        ggml_backend_cpu_set_n_threads(model.backend, n_threads);
    }

    ggml_backend_graph_compute(model.backend, gf);

    //ggml_graph_print(gf);

    return gf;
}